

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseSparseProductWithPruning.h
# Opt level: O0

void Eigen::internal::
     sparse_sparse_product_with_pruning_impl<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
               (SparseMatrix<double,_0,_int> *lhs,SparseMatrix<double,_0,_int> *rhs,
               SparseMatrix<double,_0,_int> *res,RealScalar *tolerance)

{
  double dVar1;
  double dVar2;
  undefined4 outer;
  bool bVar3;
  Index IVar4;
  Index IVar5;
  Scalar_conflict *pSVar6;
  char *pcVar7;
  Scalar *pSVar8;
  int __c;
  int __c_00;
  int __c_01;
  AmbiVector<double,_int> *vec;
  SparseMatrix<double,_0,_int> *__s;
  Scalar_conflict SVar9;
  undefined1 local_108 [8];
  Iterator it;
  InnerIterator lhsIt;
  Scalar x;
  InnerIterator rhsIt;
  Index j;
  double ratioColRes;
  undefined1 local_68 [4];
  Index estimated_nnz_prod;
  AmbiVector<double,_int> tempVector;
  Index cols;
  Index rows;
  RealScalar *tolerance_local;
  SparseMatrix<double,_0,_int> *res_local;
  SparseMatrix<double,_0,_int> *rhs_local;
  SparseMatrix<double,_0,_int> *lhs_local;
  
  tempVector._52_4_ = SparseMatrix<double,_0,_int>::innerSize(lhs);
  tempVector.m_llSize = SparseMatrix<double,_0,_int>::outerSize(rhs);
  IVar4 = SparseMatrix<double,_0,_int>::outerSize(lhs);
  IVar5 = SparseMatrix<double,_0,_int>::innerSize(rhs);
  if (IVar4 == IVar5) {
    AmbiVector<double,_int>::AmbiVector((AmbiVector<double,_int> *)local_68,tempVector._52_4_);
    IVar4 = SparseMatrix<double,_0,_int>::nonZeros(lhs);
    IVar5 = SparseMatrix<double,_0,_int>::nonZeros(rhs);
    SparseMatrix<double,_0,_int>::resize(res,tempVector._52_4_,tempVector.m_llSize);
    vec = (AmbiVector<double,_int> *)(ulong)(uint)(IVar4 + IVar5);
    SparseMatrix<double,_0,_int>::reserve(res,IVar4 + IVar5);
    SparseMatrix<double,_0,_int>::rows(lhs);
    SparseMatrix<double,_0,_int>::cols(rhs);
    for (rhsIt._28_4_ = 0; (int)rhsIt._28_4_ < tempVector.m_llSize; rhsIt._28_4_ = rhsIt._28_4_ + 1)
    {
      AmbiVector<double,_int>::init((AmbiVector<double,_int> *)local_68,(EVP_PKEY_CTX *)vec);
      AmbiVector<double,_int>::setZero((AmbiVector<double,_int> *)local_68);
      __s = rhs;
      SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator
                ((InnerIterator *)&x,rhs,rhsIt._28_4_);
      while( true ) {
        bVar3 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)&x);
        if (!bVar3) break;
        AmbiVector<double,_int>::restart((AmbiVector<double,_int> *)local_68);
        pSVar8 = SparseMatrix<double,_0,_int>::InnerIterator::value((InnerIterator *)&x);
        dVar1 = *pSVar8;
        pcVar7 = SparseMatrix<double,_0,_int>::InnerIterator::index
                           ((InnerIterator *)&x,(char *)__s,__c);
        __s = lhs;
        SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator
                  ((InnerIterator *)&it.m_isDense,lhs,(Index)pcVar7);
        while( true ) {
          bVar3 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)&it.m_isDense)
          ;
          if (!bVar3) break;
          pSVar8 = SparseMatrix<double,_0,_int>::InnerIterator::value
                             ((InnerIterator *)&it.m_isDense);
          dVar2 = *pSVar8;
          pcVar7 = SparseMatrix<double,_0,_int>::InnerIterator::index
                             ((InnerIterator *)&it.m_isDense,(char *)__s,__c_00);
          __s = (SparseMatrix<double,_0,_int> *)((ulong)pcVar7 & 0xffffffff);
          pSVar6 = AmbiVector<double,_int>::coeffRef
                             ((AmbiVector<double,_int> *)local_68,(Index)pcVar7);
          *pSVar6 = dVar2 * dVar1 + *pSVar6;
          SparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)&it.m_isDense);
        }
        SparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)&x);
      }
      SparseMatrix<double,_0,_int>::startVec(res,rhsIt._28_4_);
      vec = (AmbiVector<double,_int> *)local_68;
      AmbiVector<double,_int>::Iterator::Iterator((Iterator *)local_108,vec,tolerance);
      while( true ) {
        bVar3 = AmbiVector::Iterator::operator_cast_to_bool((Iterator *)local_108);
        if (!bVar3) break;
        SVar9 = AmbiVector<double,_int>::Iterator::value((Iterator *)local_108);
        outer = rhsIt._28_4_;
        pcVar7 = AmbiVector<double,_int>::Iterator::index((Iterator *)local_108,(char *)vec,__c_01);
        vec = (AmbiVector<double,_int> *)(ulong)(uint)outer;
        pSVar8 = SparseMatrix<double,_0,_int>::insertBackByOuterInner(res,outer,(Index)pcVar7);
        *pSVar8 = SVar9;
        AmbiVector<double,_int>::Iterator::operator++((Iterator *)local_108);
      }
    }
    SparseMatrix<double,_0,_int>::finalize(res);
    AmbiVector<double,_int>::~AmbiVector((AmbiVector<double,_int> *)local_68);
    return;
  }
  __assert_fail("lhs.outerSize() == rhs.innerSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/SparseSparseProductWithPruning.h"
                ,0x1f,
                "void Eigen::internal::sparse_sparse_product_with_pruning_impl(const Lhs &, const Rhs &, ResultType &, const typename ResultType::RealScalar &) [Lhs = Eigen::SparseMatrix<double>, Rhs = Eigen::SparseMatrix<double>, ResultType = Eigen::SparseMatrix<double>]"
               );
}

Assistant:

static void sparse_sparse_product_with_pruning_impl(const Lhs& lhs, const Rhs& rhs, ResultType& res, const typename ResultType::RealScalar& tolerance)
{
  // return sparse_sparse_product_with_pruning_impl2(lhs,rhs,res);

  typedef typename remove_all<Lhs>::type::Scalar Scalar;
  typedef typename remove_all<Lhs>::type::Index Index;

  // make sure to call innerSize/outerSize since we fake the storage order.
  Index rows = lhs.innerSize();
  Index cols = rhs.outerSize();
  //Index size = lhs.outerSize();
  eigen_assert(lhs.outerSize() == rhs.innerSize());

  // allocate a temporary buffer
  AmbiVector<Scalar,Index> tempVector(rows);

  // estimate the number of non zero entries
  // given a rhs column containing Y non zeros, we assume that the respective Y columns
  // of the lhs differs in average of one non zeros, thus the number of non zeros for
  // the product of a rhs column with the lhs is X+Y where X is the average number of non zero
  // per column of the lhs.
  // Therefore, we have nnz(lhs*rhs) = nnz(lhs) + nnz(rhs)
  Index estimated_nnz_prod = lhs.nonZeros() + rhs.nonZeros();

  // mimics a resizeByInnerOuter:
  if(ResultType::IsRowMajor)
    res.resize(cols, rows);
  else
    res.resize(rows, cols);

  res.reserve(estimated_nnz_prod);
  double ratioColRes = double(estimated_nnz_prod)/double(lhs.rows()*rhs.cols());
  for (Index j=0; j<cols; ++j)
  {
    // FIXME:
    //double ratioColRes = (double(rhs.innerVector(j).nonZeros()) + double(lhs.nonZeros())/double(lhs.cols()))/double(lhs.rows());
    // let's do a more accurate determination of the nnz ratio for the current column j of res
    tempVector.init(ratioColRes);
    tempVector.setZero();
    for (typename Rhs::InnerIterator rhsIt(rhs, j); rhsIt; ++rhsIt)
    {
      // FIXME should be written like this: tmp += rhsIt.value() * lhs.col(rhsIt.index())
      tempVector.restart();
      Scalar x = rhsIt.value();
      for (typename Lhs::InnerIterator lhsIt(lhs, rhsIt.index()); lhsIt; ++lhsIt)
      {
        tempVector.coeffRef(lhsIt.index()) += lhsIt.value() * x;
      }
    }
    res.startVec(j);
    for (typename AmbiVector<Scalar,Index>::Iterator it(tempVector,tolerance); it; ++it)
      res.insertBackByOuterInner(j,it.index()) = it.value();
  }
  res.finalize();
}